

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setInterfaceInfo(CommonCore *this,InterfaceHandle handle,string_view info)

{
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_RCX;
  anon_class_16_2_43d963df *in_RDX;
  
  gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
  modify<helics::CommonCore::setInterfaceInfo(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>)::__0>
            (in_RCX,in_RDX);
  return;
}

Assistant:

void CommonCore::setInterfaceInfo(helics::InterfaceHandle handle, std::string_view info)
{
    handles.modify(
        [&](auto& hdls) { hdls.getHandleInfo(handle.baseValue())->setTag("local_info_", info); });
}